

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O2

bool __thiscall matchit::impl::Id<int>::matchValue<int_const&>(Id<int> *this,int *v)

{
  bool bVar1;
  int *piVar2;
  IdBlock<int> *pIVar3;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:1321:44)>
  local_11;
  
  bVar1 = hasValue(this);
  if (bVar1) {
    piVar2 = internalValue(this);
    bVar1 = *piVar2 == *v;
  }
  else {
    pIVar3 = (*std::__detail::__variant::
               __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
               ::_S_vtable._M_arr
               [*(__index_type *)
                 ((long)&(this->mBlock).
                         super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                         .
                         super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                         .
                         super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                         .
                         super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                         .
                         super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                         .
                         super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                 + 0x18)]._M_data)(&local_11,&this->mBlock);
    *(int **)&(pIVar3->super_IdBlockBase<int>).mVariant.
              super__Variant_base<std::monostate,_int,_int_*,_const_int_*>.
              super__Move_assign_alias<std::monostate,_int,_int_*,_const_int_*>.
              super__Copy_assign_alias<std::monostate,_int,_int_*,_const_int_*>.
              super__Move_ctor_alias<std::monostate,_int,_int_*,_const_int_*>.
              super__Copy_ctor_alias<std::monostate,_int,_int_*,_const_int_*> = v;
    *(__index_type *)
     ((long)&(pIVar3->super_IdBlockBase<int>).mVariant.
             super__Variant_base<std::monostate,_int,_int_*,_const_int_*>.
             super__Move_assign_alias<std::monostate,_int,_int_*,_const_int_*>.
             super__Copy_assign_alias<std::monostate,_int,_int_*,_const_int_*> + 8) = '\x03';
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

constexpr auto
                matchValue(Value &&v) const
            {
                if (hasValue())
                {
                    return IdTraits<std::decay_t<Type>>::equal(internalValue(), v);
                }
                IdUtil<Type>::bindValue(block().variant(), std::forward<Value>(v),
                                   StorePointer<Type, Value>{});
                return true;
            }